

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O1

nng_err http_prepare(nng_http *conn,void **data,size_t *szp)

{
  int iVar1;
  char *buf;
  ulong uVar2;
  
  iVar1 = http_snprintf(conn,(char *)0x0,0);
  uVar2 = (ulong)iVar1;
  if (uVar2 < conn->bufsz) {
    http_snprintf(conn,(char *)conn->buf,conn->bufsz);
    *data = conn->buf;
  }
  else {
    buf = (char *)nni_alloc(uVar2 + 1);
    *data = buf;
    if (buf == (char *)0x0) {
      return NNG_ENOMEM;
    }
    http_snprintf(conn,buf,uVar2 + 1);
  }
  *szp = uVar2;
  return NNG_OK;
}

Assistant:

static nng_err
http_prepare(nng_http *conn, void **data, size_t *szp)
{
	size_t len;

	// get length needed first
	len = http_snprintf(conn, NULL, 0);

	// If it fits in the fixed buffer, use it. It should cover
	// like 99% or more cases, as this buffer is 8KB.
	if (len < conn->bufsz) {
		http_snprintf(conn, (char *) conn->buf, conn->bufsz);
		*data = conn->buf;
		*szp  = len;
		return (NNG_OK);
	}

	// we have to allocate.
	if ((*data = nni_alloc(len + 1)) == NULL) {
		return (NNG_ENOMEM);
	}
	http_snprintf(conn, *data, len + 1);
	*szp = len; // this does not include the terminating null
	return (NNG_OK);
}